

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::writeLPF
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  double dVar1;
  SPxSense SVar2;
  pointer pdVar3;
  bool bVar4;
  IdxSet *this_00;
  uint uVar5;
  int iVar6;
  Nonzero<double> *pNVar7;
  size_t sVar8;
  ostream *poVar9;
  Item *pIVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  double *p_lhs;
  undefined7 in_register_00000089;
  uint uVar17;
  long lVar18;
  long in_FS_OFFSET;
  double lhs;
  char name [16];
  double rhs;
  double local_b8;
  NameSet *local_b0;
  double local_a8;
  double local_a0;
  undefined **local_98;
  SVectorBase<double> local_90;
  Nonzero<double> *local_80 [2];
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  IdxSet *local_38;
  
  local_a8 = (double)CONCAT44(local_a8._4_4_,(int)CONCAT71(in_register_00000089,writeZeroObjective))
  ;
  lVar18 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar18 + -0x18) + 8) = 0x10;
  lVar18 = *(long *)(lVar18 + -0x18);
  *(uint *)(p_output + lVar18 + 0x18) = *(uint *)(p_output + lVar18 + 0x18) & 0xfffffefb | 0x100;
  SVar2 = this->thesense;
  pcVar14 = "Maximize\n";
  if (SVar2 == MINIMIZE) {
    pcVar14 = "Minimize\n";
  }
  local_b0 = p_cnames;
  local_38 = &p_intvars->super_IdxSet;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,9);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"  obj: ",7);
  local_90.m_elem = (Nonzero<double> *)0x0;
  local_90.memsize = 0;
  local_90.memused = 0;
  local_98 = &PTR__DSVectorBase_0069e2b8;
  local_80[0] = (Nonzero<double> *)0x0;
  uVar5 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  uVar17 = 2;
  if (0 < (int)uVar5) {
    uVar17 = uVar5;
  }
  spx_alloc<soplex::Nonzero<double>*>(local_80,uVar17);
  local_90.m_elem = local_80[0];
  local_90.memused = 0;
  local_90.memsize = uVar17;
  uVar5 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  uVar17 = 0;
  if (0 < (int)uVar5) {
    uVar17 = uVar5;
  }
  spx_realloc<soplex::Nonzero<double>*>(local_80,uVar17);
  local_90.m_elem = local_80[0];
  pdVar3 = (this->super_LPColSetBase<double>).object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
  if ((int)uVar5 < 1) {
    local_90.memused = 0;
    local_90.memsize = uVar17;
  }
  else {
    iVar11 = 0;
    pNVar7 = local_80[0];
    uVar16 = (ulong)(uVar5 & 0x7fffffff);
    do {
      uVar15 = uVar16 - 1;
      dVar1 = pdVar3[uVar15];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pNVar7->idx = (int)uVar15;
        pNVar7->val = dVar1;
        pNVar7 = pNVar7 + 1;
        iVar11 = iVar11 + 1;
      }
      bVar4 = 1 < uVar16;
      uVar16 = uVar15;
    } while (bVar4);
    local_90.memused = iVar11;
    local_90.memsize = uVar17;
    if (iVar11 != 0) {
      pNVar7 = local_80[0];
      do {
        pNVar7->val = pNVar7->val * (double)SVar2;
        pNVar7 = pNVar7 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
  }
  LPFwriteSVector<double>(this,p_output,local_b0,&local_90,local_a8._0_1_);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  local_98 = &PTR__DSVectorBase_0069e2b8;
  if (local_80[0] != (Nonzero<double> *)0x0) {
    free(local_80[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Subject To\n",0xb);
  iVar11 = (int)p_output;
  if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    local_58 = *(double *)(in_FS_OFFSET + -8);
    uStack_50 = 0;
    local_68 = -local_58;
    uStack_60 = 0x8000000000000000;
    lVar18 = 0;
    do {
      local_b8 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar18];
      local_a8 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar18];
      iVar13 = (int)lVar18;
      local_a0 = local_b8;
      local_40 = local_a8;
      ::soplex::infinity::__tls_init();
      if ((local_a0 <= local_68) || (::soplex::infinity::__tls_init(), local_58 <= local_a8)) {
LAB_001b04d3:
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>
                            ((SPxLPBase<double> *)
                             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                             iVar13,p_rnames,(char *)&local_98,iVar13);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output," : ",3);
        pIVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar18].idx;
        p_lhs = &local_b8;
      }
      else {
        if ((local_a0 == local_a8) && (!NAN(local_a0) && !NAN(local_a8))) goto LAB_001b04d3;
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>
                            ((SPxLPBase<double> *)
                             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                             iVar13,p_rnames,(char *)&local_98,iVar13);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_1 : ",5);
        iVar6 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar18].idx;
        pIVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        ::soplex::infinity::__tls_init();
        local_70 = local_58;
        LPFwriteRow<double>(this,p_output,local_b0,(SVectorBase<double> *)(pIVar10 + iVar6),
                            &local_b8,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>
                            ((SPxLPBase<double> *)
                             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                             iVar13,p_rnames,(char *)&local_98,iVar13);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_2 : ",5);
        pIVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar18].idx;
        ::soplex::infinity::__tls_init();
        local_70 = local_68;
        p_lhs = &local_70;
      }
      LPFwriteRow<double>(this,p_output,local_b0,(SVectorBase<double> *)pIVar10,p_lhs,&local_40);
      lVar18 = lVar18 + 1;
    } while (lVar18 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Bounds\n",7);
  this_00 = local_38;
  if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    local_68 = *(double *)(in_FS_OFFSET + -8);
    uStack_60 = 0;
    local_58 = -local_68;
    uStack_50 = 0x8000000000000000;
    lVar18 = 0;
    do {
      dVar1 = (this->super_LPColSetBase<double>).low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar18];
      local_a8 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar18];
      iVar13 = (int)lVar18;
      if ((dVar1 != local_a8) || (NAN(dVar1) || NAN(local_a8))) {
        local_a0 = dVar1;
        ::soplex::infinity::__tls_init();
        ::soplex::infinity::__tls_init();
        if (local_a0 <= local_58) {
          if (local_68 <= local_a8) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            pcVar14 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar13,local_b0,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar8 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
            }
            lVar12 = 6;
            pcVar14 = " free\n";
            poVar9 = p_output;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"   -Inf <= ",0xb);
            pcVar14 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar13,local_b0,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar8 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(p_output," <= ",4);
LAB_001b0aac:
            poVar9 = std::ostream::_M_insert<double>(local_a8);
LAB_001b0aeb:
            local_b8 = (double)CONCAT71(local_b8._1_7_,10);
            lVar12 = 1;
            pcVar14 = (char *)&local_b8;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar12);
        }
        else {
          if (local_a8 < local_68) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            if ((local_a0 != 0.0) || (NAN(local_a0))) {
              poVar9 = std::ostream::_M_insert<double>(local_a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," <= ",4);
              pcVar14 = getColName<double>((SPxLPBase<double> *)
                                           (this->super_LPColSetBase<double>).
                                           super_SVSetBase<double>.set.thekey,iVar13,local_b0,
                                           (char *)&local_98);
              if (pcVar14 == (char *)0x0) {
                std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
              }
              else {
                sVar8 = strlen(pcVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," <= ",4);
              goto LAB_001b0aac;
            }
            pcVar14 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar13,local_b0,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar8 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
            }
            lVar12 = 4;
            pcVar14 = " <= ";
            goto LAB_001b087a;
          }
          if ((local_a0 != 0.0) || (NAN(local_a0))) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            poVar9 = std::ostream::_M_insert<double>(local_a0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," <= ",4);
            pcVar14 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar13,local_b0,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,sVar8);
            }
            goto LAB_001b0aeb;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar14 = getColName<double>((SPxLPBase<double> *)
                                     (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                     thekey,iVar13,local_b0,(char *)&local_98);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
        }
        lVar12 = 3;
        pcVar14 = " = ";
LAB_001b087a:
        std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,lVar12);
        poVar9 = std::ostream::_M_insert<double>(local_a8);
        local_b8 = (double)CONCAT71(local_b8._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_b8,1);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (((this_00 != (IdxSet *)0x0) && (0 < this_00->num)) &&
     (std::__ostream_insert<char,std::char_traits<char>>(p_output,"Generals\n",9),
     0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    iVar13 = 0;
    do {
      iVar6 = IdxSet::pos(this_00,iVar13);
      if (-1 < iVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar14 = getColName<double>((SPxLPBase<double> *)
                                     (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                     thekey,iVar13,local_b0,(char *)&local_98);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar11 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"End",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + (char)p_output);
  std::ostream::put((char)p_output);
  std::ostream::flush();
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}